

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

string * __thiscall
Function::Prologue::to_string_abi_cxx11_(string *__return_storage_ptr__,Prologue *this,int indent)

{
  int iVar1;
  reference pvVar2;
  int i;
  size_type sVar3;
  char *pcVar4;
  string indent_str;
  string local_258;
  char buff [512];
  
  indent_str._M_dataplus._M_p = (pointer)&indent_str.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent_str,(char)indent);
  if (this->decoded == false) {
    std::operator+(__return_storage_ptr__,&indent_str,"BAD PROLOGUE");
  }
  else {
    iVar1 = sprintf(buff,"%sstack: total 0x%02x, fp? %d ra? %d ep? %d",indent_str._M_dataplus._M_p,
                    (ulong)(uint)this->total_stack_usage,(ulong)this->fp_set,
                    (ulong)this->ra_backed_up,(uint)this->epilogue_ok);
    pcVar4 = buff + iVar1;
    if (this->n_stack_var_bytes != 0) {
      iVar1 = sprintf(pcVar4,"\n%sstack_vars: %d bytes at %d",indent_str._M_dataplus._M_p,
                      (ulong)(uint)this->n_stack_var_bytes,(ulong)(uint)this->stack_var_offset);
      pcVar4 = pcVar4 + iVar1;
    }
    if (this->n_gpr_backup != 0) {
      iVar1 = sprintf(pcVar4,"\n%sgprs:",indent_str._M_dataplus._M_p);
      pcVar4 = pcVar4 + iVar1;
      for (sVar3 = 0; (long)sVar3 < (long)this->n_gpr_backup; sVar3 = sVar3 + 1) {
        pvVar2 = std::vector<Register,_std::allocator<Register>_>::at
                           ((vector<Register,_std::allocator<Register>_> *)
                            (anonymous_namespace)::gpr_backups,sVar3);
        Register::to_string_abi_cxx11_(&local_258,pvVar2);
        iVar1 = sprintf(pcVar4," %s",local_258._M_dataplus._M_p);
        pcVar4 = pcVar4 + iVar1;
        std::__cxx11::string::~string((string *)&local_258);
      }
    }
    if (this->n_fpr_backup != 0) {
      iVar1 = sprintf(pcVar4,"\n%sfprs:",indent_str._M_dataplus._M_p);
      pcVar4 = pcVar4 + iVar1;
      for (sVar3 = 0; (long)sVar3 < (long)this->n_fpr_backup; sVar3 = sVar3 + 1) {
        pvVar2 = std::vector<Register,_std::allocator<Register>_>::at
                           ((vector<Register,_std::allocator<Register>_> *)
                            (anonymous_namespace)::fpr_backups,sVar3);
        Register::to_string_abi_cxx11_(&local_258,pvVar2);
        iVar1 = sprintf(pcVar4," %s",local_258._M_dataplus._M_p);
        pcVar4 = pcVar4 + iVar1;
        std::__cxx11::string::~string((string *)&local_258);
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,buff,(allocator *)&local_258);
  }
  std::__cxx11::string::~string((string *)&indent_str);
  return __return_storage_ptr__;
}

Assistant:

std::string Function::Prologue::to_string(int indent) const {
  char buff[512];
  char* buff_ptr = buff;
  std::string indent_str(indent, ' ');
  if (!decoded) {
    return indent_str + "BAD PROLOGUE";
  }
  buff_ptr += sprintf(buff_ptr, "%sstack: total 0x%02x, fp? %d ra? %d ep? %d", indent_str.c_str(),
                      total_stack_usage, fp_set, ra_backed_up, epilogue_ok);
  if (n_stack_var_bytes) {
    buff_ptr += sprintf(buff_ptr, "\n%sstack_vars: %d bytes at %d", indent_str.c_str(),
                        n_stack_var_bytes, stack_var_offset);
  }
  if (n_gpr_backup) {
    buff_ptr += sprintf(buff_ptr, "\n%sgprs:", indent_str.c_str());
    for (int i = 0; i < n_gpr_backup; i++) {
      buff_ptr += sprintf(buff_ptr, " %s", gpr_backups.at(i).to_string().c_str());
    }
  }
  if (n_fpr_backup) {
    buff_ptr += sprintf(buff_ptr, "\n%sfprs:", indent_str.c_str());
    for (int i = 0; i < n_fpr_backup; i++) {
      buff_ptr += sprintf(buff_ptr, " %s", fpr_backups.at(i).to_string().c_str());
    }
  }
  return {buff};
}